

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O0

double __thiscall
calculator::ExpressionTree::calcFunctionValue(ExpressionTree *this,node *x,string *function)

{
  bool bVar1;
  UnaryFunctionException *this_00;
  pointer ppVar2;
  FunctionDeclareException *this_01;
  double dVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
  local_38;
  iterator it;
  string *function_local;
  node *x_local;
  ExpressionTree *this_local;
  
  if (x == (node *)0x0) {
    this_00 = (UnaryFunctionException *)__cxa_allocate_exception(0x28);
    UnaryFunctionException::UnaryFunctionException(this_00,function);
    __cxa_throw(this_00,&UnaryFunctionException::typeinfo,
                UnaryFunctionException::~UnaryFunctionException);
  }
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>_>_>
       ::find(&(this->lexer_).unary_functions,function);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>_>_>
       ::end(&(this->lexer_).unary_functions);
  bVar1 = std::__detail::operator!=(&local_38,&local_40);
  if (!bVar1) {
    this_01 = (FunctionDeclareException *)__cxa_allocate_exception(0x28);
    FunctionDeclareException::FunctionDeclareException(this_01,function);
    __cxa_throw(this_01,&FunctionDeclareException::typeinfo,
                FunctionDeclareException::~FunctionDeclareException);
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_false,_true>
                         *)&local_38);
  dVar3 = std::function<double_(double)>::operator()(&ppVar2->second,x->value);
  return dVar3;
}

Assistant:

double ExpressionTree::calcFunctionValue(node *x, std::string function) {
    if (x == nullptr) throw UnaryFunctionException(function);
    if (auto it = lexer_.unary_functions.find(function);
        it != lexer_.unary_functions.end()) {
        return it->second(x->value);
    }
    throw FunctionDeclareException(function);
}